

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

int sys_parsedevlist(int *np,int *vecp,int max,char *str)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char *endp;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)max;
  if (max < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
LAB_0016f8f5:
      *np = (int)uVar2;
      return (int)uVar2;
    }
    if (*str == '\0') {
LAB_0016f8f2:
      uVar2 = uVar3 & 0xffffffff;
      goto LAB_0016f8f5;
    }
    lVar1 = strtol(str,&endp,10);
    vecp[uVar3] = (int)lVar1;
    if (endp == str) goto LAB_0016f8f2;
    if (*endp == '\0') {
      uVar3 = uVar3 + 1;
      goto LAB_0016f8f2;
    }
    str = endp + 1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static int sys_parsedevlist(int *np, int *vecp, int max, const char *str)
{
    int n = 0;
    while (n < max)
    {
        if (! *str) break;
        else
        {
            char *endp;
            vecp[n] = (int)strtol(str, &endp, 10);
            if (endp == str)
                break;
            n++;
            if (! *endp)
                break;
            str = endp + 1;
        }
    }
    return (*np = n);
}